

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapInsert(jx9_hashmap *pMap,jx9_value *pKey,jx9_value *pVal)

{
  int iVar1;
  sxi32 sVar2;
  jx9_value *pjVar3;
  jx9_value *pElem_1;
  jx9_value *pElem;
  jx9_hashmap_node *pjStack_30;
  sxi32 rc;
  jx9_hashmap_node *pNode;
  jx9_value *pVal_local;
  jx9_value *pKey_local;
  jx9_hashmap *pMap_local;
  
  pjStack_30 = (jx9_hashmap_node *)0x0;
  if (((pMap->nEntry == 0) && (pKey != (jx9_value *)0x0)) && ((pKey->iFlags & 1U) != 0)) {
    pMap->iFlags = pMap->iFlags | 1;
  }
  pNode = (jx9_hashmap_node *)pVal;
  pVal_local = pKey;
  pKey_local = (jx9_value *)pMap;
  if ((pKey != (jx9_value *)0x0) && ((pKey->iFlags & 0x141U) != 0)) {
    if ((pKey->iFlags & 1U) == 0) {
      jx9MemObjToString(pKey);
    }
    if (((pVal_local->sBlob).nByte != 0) &&
       (iVar1 = HashmapIsIntKey(&pVal_local->sBlob), iVar1 == 0)) {
      sVar2 = HashmapLookupBlobKey
                        ((jx9_hashmap *)pKey_local,(pVal_local->sBlob).pBlob,
                         (pVal_local->sBlob).nByte,&stack0xffffffffffffffd0);
      if (sVar2 == 0) {
        pjVar3 = (jx9_value *)SySetAt((SySet *)((pKey_local->x).iVal + 0x200),pjStack_30->nValIdx);
        if (pjVar3 != (jx9_value *)0x0) {
          if (pNode == (jx9_hashmap_node *)0x0) {
            jx9MemObjToNull(pjVar3);
          }
          else {
            jx9MemObjStore((jx9_value *)pNode,pjVar3);
          }
        }
        return 0;
      }
      sVar2 = HashmapInsertBlobKey
                        ((jx9_hashmap *)pKey_local,(pVal_local->sBlob).pBlob,
                         (pVal_local->sBlob).nByte,(jx9_value *)pNode);
      return sVar2;
    }
    if ((pVal_local->sBlob).nByte == 0) {
      pVal_local = (jx9_value *)0x0;
    }
  }
  if (pVal_local == (jx9_value *)0x0) {
    pElem._4_4_ = HashmapInsertIntKey((jx9_hashmap *)pKey_local,*(sxi64 *)&pKey_local[1].iFlags,
                                      (jx9_value *)pNode);
    if (pElem._4_4_ == 0) {
      *(long *)&pKey_local[1].iFlags = *(long *)&pKey_local[1].iFlags + 1;
    }
  }
  else {
    if ((pVal_local->iFlags & 2U) == 0) {
      jx9MemObjToInteger(pVal_local);
    }
    sVar2 = HashmapLookupIntKey((jx9_hashmap *)pKey_local,(pVal_local->x).iVal,
                                &stack0xffffffffffffffd0);
    if (sVar2 == 0) {
      pjVar3 = (jx9_value *)SySetAt((SySet *)((pKey_local->x).iVal + 0x200),pjStack_30->nValIdx);
      if (pjVar3 != (jx9_value *)0x0) {
        if (pNode == (jx9_hashmap_node *)0x0) {
          jx9MemObjToNull(pjVar3);
        }
        else {
          jx9MemObjStore((jx9_value *)pNode,pjVar3);
        }
      }
      return 0;
    }
    pElem._4_4_ = HashmapInsertIntKey((jx9_hashmap *)pKey_local,(pVal_local->x).iVal,
                                      (jx9_value *)pNode);
    if ((pElem._4_4_ == 0) && (*(long *)&pKey_local[1].iFlags <= (pVal_local->x).iVal)) {
      *(sxi64 *)&pKey_local[1].iFlags = (pVal_local->x).iVal + 1;
      while (sVar2 = HashmapLookupIntKey((jx9_hashmap *)pKey_local,*(sxi64 *)&pKey_local[1].iFlags,
                                         (jx9_hashmap_node **)0x0), sVar2 == 0) {
        *(long *)&pKey_local[1].iFlags = *(long *)&pKey_local[1].iFlags + 1;
      }
    }
  }
  return pElem._4_4_;
}

Assistant:

static sxi32 HashmapInsert(
	jx9_hashmap *pMap, /* Target hashmap */
	jx9_value *pKey,   /* Lookup key  */
	jx9_value *pVal    /* Node value */
	)
{
	jx9_hashmap_node *pNode = 0;
	sxi32 rc = SXRET_OK;
	if( pMap->nEntry < 1 && pKey && (pKey->iFlags & MEMOBJ_STRING) ){
		pMap->iFlags |= HASHMAP_JSON_OBJECT;
	}
	if( pKey && (pKey->iFlags & (MEMOBJ_STRING|MEMOBJ_HASHMAP|MEMOBJ_RES)) ){
		if( (pKey->iFlags & MEMOBJ_STRING) == 0 ){
			/* Force a string cast */
			jx9MemObjToString(&(*pKey));
		}
		if( SyBlobLength(&pKey->sBlob) < 1 || HashmapIsIntKey(&pKey->sBlob) ){
			if(SyBlobLength(&pKey->sBlob) < 1){
				/* Automatic index assign */
				pKey = 0;
			}
			goto IntKey;
		}
		if( SXRET_OK == HashmapLookupBlobKey(&(*pMap), SyBlobData(&pKey->sBlob), 
			SyBlobLength(&pKey->sBlob), &pNode) ){
				/* Overwrite the old value */
				jx9_value *pElem;
				pElem = (jx9_value *)SySetAt(&pMap->pVm->aMemObj, pNode->nValIdx);
				if( pElem ){
					if( pVal ){
						jx9MemObjStore(pVal, pElem);
					}else{
						/* Nullify the entry */
						jx9MemObjToNull(pElem);
					}
				}
				return SXRET_OK;
		}
		/* Perform a blob-key insertion */
		rc = HashmapInsertBlobKey(&(*pMap),SyBlobData(&pKey->sBlob),SyBlobLength(&pKey->sBlob),&(*pVal));
		return rc;
	}
IntKey:
	if( pKey ){
		if((pKey->iFlags & MEMOBJ_INT) == 0 ){
			/* Force an integer cast */
			jx9MemObjToInteger(pKey);
		}
		if( SXRET_OK == HashmapLookupIntKey(&(*pMap), pKey->x.iVal, &pNode) ){
			/* Overwrite the old value */
			jx9_value *pElem;
			pElem = (jx9_value *)SySetAt(&pMap->pVm->aMemObj, pNode->nValIdx);
			if( pElem ){
				if( pVal ){
					jx9MemObjStore(pVal, pElem);
				}else{
					/* Nullify the entry */
					jx9MemObjToNull(pElem);
				}
			}
			return SXRET_OK;
		}
		/* Perform a 64-bit-int-key insertion */
		rc = HashmapInsertIntKey(&(*pMap), pKey->x.iVal, &(*pVal));
		if( rc == SXRET_OK ){
			if( pKey->x.iVal >= pMap->iNextIdx ){
				/* Increment the automatic index */ 
				pMap->iNextIdx = pKey->x.iVal + 1;
				/* Make sure the automatic index is not reserved */
				while( SXRET_OK == HashmapLookupIntKey(&(*pMap), pMap->iNextIdx, 0) ){
					pMap->iNextIdx++;
				}
			}
		}
	}else{
		/* Assign an automatic index */
		rc = HashmapInsertIntKey(&(*pMap),pMap->iNextIdx,&(*pVal));
		if( rc == SXRET_OK ){
			++pMap->iNextIdx;
		}
	}
	/* Insertion result */
	return rc;
}